

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHint(int target,int hint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int hint_local;
  int target_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    iVar1 = _glfw.hints.redBits;
    iVar2 = _glfw.hints.greenBits;
    iVar3 = _glfw.hints.blueBits;
    iVar4 = _glfw.hints.alphaBits;
    iVar5 = _glfw.hints.depthBits;
    iVar6 = _glfw.hints.stencilBits;
    iVar7 = _glfw.hints.accumRedBits;
    iVar8 = _glfw.hints.accumGreenBits;
    iVar9 = _glfw.hints.accumBlueBits;
    iVar10 = _glfw.hints.accumAlphaBits;
    iVar11 = _glfw.hints.auxBuffers;
    iVar12 = _glfw.hints.stereo;
    iVar13 = _glfw.hints.resizable;
    iVar14 = _glfw.hints.visible;
    iVar15 = _glfw.hints.decorated;
    iVar16 = _glfw.hints.focused;
    iVar17 = _glfw.hints.autoIconify;
    iVar18 = _glfw.hints.floating;
    iVar19 = _glfw.hints.samples;
    iVar20 = _glfw.hints.sRGB;
    iVar21 = _glfw.hints.refreshRate;
    iVar22 = _glfw.hints.doublebuffer;
    iVar23 = _glfw.hints.api;
    iVar24 = _glfw.hints.major;
    iVar25 = _glfw.hints.minor;
    iVar26 = _glfw.hints.forward;
    iVar27 = _glfw.hints.debug;
    iVar28 = _glfw.hints.profile;
    iVar29 = _glfw.hints.robustness;
    iVar30 = _glfw.hints.release;
  }
  else {
    iVar1 = _glfw.hints.redBits;
    iVar2 = _glfw.hints.greenBits;
    iVar3 = _glfw.hints.blueBits;
    iVar4 = _glfw.hints.alphaBits;
    iVar5 = _glfw.hints.depthBits;
    iVar6 = _glfw.hints.stencilBits;
    iVar7 = _glfw.hints.accumRedBits;
    iVar8 = _glfw.hints.accumGreenBits;
    iVar9 = _glfw.hints.accumBlueBits;
    iVar10 = _glfw.hints.accumAlphaBits;
    iVar11 = _glfw.hints.auxBuffers;
    iVar12 = _glfw.hints.stereo;
    iVar13 = _glfw.hints.resizable;
    iVar14 = _glfw.hints.visible;
    iVar15 = _glfw.hints.decorated;
    iVar16 = hint;
    iVar17 = _glfw.hints.autoIconify;
    iVar18 = _glfw.hints.floating;
    iVar19 = _glfw.hints.samples;
    iVar20 = _glfw.hints.sRGB;
    iVar21 = _glfw.hints.refreshRate;
    iVar22 = _glfw.hints.doublebuffer;
    iVar23 = _glfw.hints.api;
    iVar24 = _glfw.hints.major;
    iVar25 = _glfw.hints.minor;
    iVar26 = _glfw.hints.forward;
    iVar27 = _glfw.hints.debug;
    iVar28 = _glfw.hints.profile;
    iVar29 = _glfw.hints.robustness;
    iVar30 = _glfw.hints.release;
    if ((((((((target != 0x20001) &&
             (iVar13 = hint, iVar16 = _glfw.hints.focused, target != 0x20003)) &&
            (iVar13 = _glfw.hints.resizable, iVar14 = hint, target != 0x20004)) &&
           (((iVar14 = _glfw.hints.visible, iVar15 = hint, target != 0x20005 &&
             (iVar15 = _glfw.hints.decorated, iVar17 = hint, target != 0x20006)) &&
            ((iVar17 = _glfw.hints.autoIconify, iVar18 = hint, target != 0x20007 &&
             ((iVar1 = hint, iVar18 = _glfw.hints.floating, target != 0x21001 &&
              (iVar1 = _glfw.hints.redBits, iVar2 = hint, target != 0x21002)))))))) &&
          (iVar2 = _glfw.hints.greenBits, iVar3 = hint, target != 0x21003)) &&
         (((iVar3 = _glfw.hints.blueBits, iVar4 = hint, target != 0x21004 &&
           (iVar4 = _glfw.hints.alphaBits, iVar5 = hint, target != 0x21005)) &&
          (iVar5 = _glfw.hints.depthBits, iVar6 = hint, target != 0x21006)))) &&
        (((iVar6 = _glfw.hints.stencilBits, iVar7 = hint, target != 0x21007 &&
          (iVar7 = _glfw.hints.accumRedBits, iVar8 = hint, target != 0x21008)) &&
         ((iVar8 = _glfw.hints.accumGreenBits, iVar9 = hint, target != 0x21009 &&
          ((iVar9 = _glfw.hints.accumBlueBits, iVar10 = hint, target != 0x2100a &&
           (iVar10 = _glfw.hints.accumAlphaBits, iVar11 = hint, target != 0x2100b)))))))) &&
       (((iVar11 = _glfw.hints.auxBuffers, iVar12 = hint, target != 0x2100c &&
         (((((iVar12 = _glfw.hints.stereo, iVar19 = hint, target != 0x2100d &&
             (iVar19 = _glfw.hints.samples, iVar20 = hint, target != 0x2100e)) &&
            (iVar20 = _glfw.hints.sRGB, iVar21 = hint, target != 0x2100f)) &&
           ((iVar21 = _glfw.hints.refreshRate, iVar22 = hint, target != 0x21010 &&
            (iVar22 = _glfw.hints.doublebuffer, iVar23 = hint, target != 0x22001)))) &&
          ((iVar23 = _glfw.hints.api, iVar24 = hint, target != 0x22002 &&
           ((iVar24 = _glfw.hints.major, iVar25 = hint, target != 0x22003 &&
            (iVar25 = _glfw.hints.minor, iVar29 = hint, target != 0x22005)))))))) &&
        ((iVar26 = hint, iVar29 = _glfw.hints.robustness, target != 0x22006 &&
         (((iVar26 = _glfw.hints.forward, iVar27 = hint, target != 0x22007 &&
           (iVar27 = _glfw.hints.debug, iVar28 = hint, target != 0x22008)) &&
          (iVar28 = _glfw.hints.profile, iVar30 = hint, target != 0x22009)))))))) {
      _glfwInputError(0x10003,(char *)0x0);
      iVar1 = _glfw.hints.redBits;
      iVar2 = _glfw.hints.greenBits;
      iVar3 = _glfw.hints.blueBits;
      iVar4 = _glfw.hints.alphaBits;
      iVar5 = _glfw.hints.depthBits;
      iVar6 = _glfw.hints.stencilBits;
      iVar7 = _glfw.hints.accumRedBits;
      iVar8 = _glfw.hints.accumGreenBits;
      iVar9 = _glfw.hints.accumBlueBits;
      iVar10 = _glfw.hints.accumAlphaBits;
      iVar11 = _glfw.hints.auxBuffers;
      iVar12 = _glfw.hints.stereo;
      iVar13 = _glfw.hints.resizable;
      iVar14 = _glfw.hints.visible;
      iVar15 = _glfw.hints.decorated;
      iVar16 = _glfw.hints.focused;
      iVar17 = _glfw.hints.autoIconify;
      iVar18 = _glfw.hints.floating;
      iVar19 = _glfw.hints.samples;
      iVar20 = _glfw.hints.sRGB;
      iVar21 = _glfw.hints.refreshRate;
      iVar22 = _glfw.hints.doublebuffer;
      iVar23 = _glfw.hints.api;
      iVar24 = _glfw.hints.major;
      iVar25 = _glfw.hints.minor;
      iVar26 = _glfw.hints.forward;
      iVar27 = _glfw.hints.debug;
      iVar28 = _glfw.hints.profile;
      iVar29 = _glfw.hints.robustness;
      iVar30 = _glfw.hints.release;
    }
  }
  _glfw.hints.release = iVar30;
  _glfw.hints.robustness = iVar29;
  _glfw.hints.profile = iVar28;
  _glfw.hints.debug = iVar27;
  _glfw.hints.forward = iVar26;
  _glfw.hints.minor = iVar25;
  _glfw.hints.major = iVar24;
  _glfw.hints.api = iVar23;
  _glfw.hints.doublebuffer = iVar22;
  _glfw.hints.refreshRate = iVar21;
  _glfw.hints.sRGB = iVar20;
  _glfw.hints.samples = iVar19;
  _glfw.hints.floating = iVar18;
  _glfw.hints.autoIconify = iVar17;
  _glfw.hints.focused = iVar16;
  _glfw.hints.decorated = iVar15;
  _glfw.hints.visible = iVar14;
  _glfw.hints.resizable = iVar13;
  _glfw.hints.stereo = iVar12;
  _glfw.hints.auxBuffers = iVar11;
  _glfw.hints.accumAlphaBits = iVar10;
  _glfw.hints.accumBlueBits = iVar9;
  _glfw.hints.accumGreenBits = iVar8;
  _glfw.hints.accumRedBits = iVar7;
  _glfw.hints.stencilBits = iVar6;
  _glfw.hints.depthBits = iVar5;
  _glfw.hints.alphaBits = iVar4;
  _glfw.hints.blueBits = iVar3;
  _glfw.hints.greenBits = iVar2;
  _glfw.hints.redBits = iVar1;
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.stereo = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.doublebuffer = hint;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.resizable = hint;
            break;
        case GLFW_DECORATED:
            _glfw.hints.decorated = hint;
            break;
        case GLFW_FOCUSED:
            _glfw.hints.focused = hint;
            break;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.autoIconify = hint;
            break;
        case GLFW_FLOATING:
            _glfw.hints.floating = hint;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.visible = hint;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.sRGB = hint;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.api = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.major = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.minor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.robustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.forward = hint;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.debug = hint;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.profile = hint;
            break;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.release = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            break;
    }
}